

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

void __thiscall QRegularExpression::setPattern(QRegularExpression *this,QString *pattern)

{
  QRegularExpressionPrivate *pQVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  QStringView rhs;
  QStringView lhs;
  
  pQVar1 = (this->d).d.ptr;
  lVar2 = (pQVar1->pattern).d.size;
  lVar3 = (pattern->d).size;
  if (lVar2 == lVar3) {
    rhs.m_data = (pattern->d).ptr;
    rhs.m_size = lVar3;
    lhs.m_data = (pQVar1->pattern).d.ptr;
    lhs.m_size = lVar2;
    bVar4 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar4) {
      return;
    }
  }
  if ((pQVar1 != (QRegularExpressionPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach_helper(&this->d);
  }
  pQVar1 = (this->d).d.ptr;
  pQVar1->isDirty = true;
  QString::operator=(&pQVar1->pattern,pattern);
  return;
}

Assistant:

void QRegularExpression::setPattern(const QString &pattern)
{
    if (d->pattern == pattern)
        return;
    d.detach();
    d->isDirty = true;
    d->pattern = pattern;
}